

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O0

void onsig(int param_1)

{
  uint local_1c;
  uint local_18;
  int y;
  int x;
  int param_0_local;
  
  if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
    endwin();
    initscr();
    noecho();
    cbreak();
    keypad(_stdscr,1);
    refresh();
    if (_stdscr == 0) {
      local_18 = 0xffffffff;
      local_1c = 0xffffffff;
    }
    else {
      local_18 = (int)*(short *)(_stdscr + 4) + 1;
      local_1c = (int)*(short *)(_stdscr + 6) + 1;
    }
    (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[3])
              (cmCursesForm::CurrentForm,1,1,(ulong)local_1c,(ulong)local_18);
    (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[4])();
  }
  signal(0x1c,onsig);
  return;
}

Assistant:

void onsig(int)
{
  if (cmCursesForm::CurrentForm)
    {
    endwin();
    initscr(); /* Initialization */
    noecho(); /* Echo off */
    cbreak(); /* nl- or cr not needed */
    keypad(stdscr,TRUE); /* Use key symbols as
                            KEY_DOWN*/
    refresh();
    int x,y;
    getmaxyx(stdscr, y, x);
    cmCursesForm::CurrentForm->Render(1,1,x,y);
    cmCursesForm::CurrentForm->UpdateStatusBar();
    }
  signal(SIGWINCH, onsig);
}